

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedLinearAllocator.hpp
# Opt level: O2

void * __thiscall
Diligent::FixedLinearAllocator::Allocate(FixedLinearAllocator *this,size_t size,size_t alignment)

{
  pointer Args_2;
  type tVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  char (*Args_1) [25];
  pointer pDVar4;
  ulong uVar5;
  size_t sVar6;
  char (*in_stack_ffffffffffffffa8) [2];
  string msg;
  size_t alignment_local;
  type local_28;
  
  alignment_local = alignment;
  if ((size != 0) && (this->m_pDataStart == (uint8_t *)0x0)) {
    FormatString<char[30]>(&msg,(char (*) [30])"Memory has not been allocated");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
               ,0xe0);
    std::__cxx11::string::~string((string *)&msg);
  }
  Args_1 = (char (*) [25])(alignment ^ (ulong)(alignment - 1));
  if (Args_1 <= (char (*) [25])(alignment - 1)) {
    FormatString<char[33]>(&msg,(char (*) [33])"Alignment is not a power of two!");
    Args_1 = (char (*) [25])0xe1;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
               ,0xe1);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (size == 0) {
    puVar2 = (uint8_t *)0x0;
  }
  else {
    tVar1 = AlignUp<unsigned_long,unsigned_long>(size,alignment);
    local_28 = tVar1;
    if (this->m_DbgUsingExternalMemory == false) {
      uVar5 = this->m_DbgCurrAllocation;
      pDVar4 = (this->m_DbgAllocations).
               super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->m_DbgAllocations).
                         super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar4) / 0x18) <= uVar5
         ) {
        FormatString<char[82]>
                  (&msg,(char (*) [82])
                        "Allocation number exceed the number of allocations that were originally reserved."
                  );
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                   ,0xec);
        std::__cxx11::string::~string((string *)&msg);
        uVar5 = this->m_DbgCurrAllocation;
        pDVar4 = (this->m_DbgAllocations).
                 super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      this->m_DbgCurrAllocation = uVar5 + 1;
      Args_2 = pDVar4 + uVar5;
      if (pDVar4[uVar5].size != tVar1) {
        FormatString<char[18],unsigned_long,char[48],unsigned_long,char[2]>
                  (&msg,(Diligent *)"Allocation size (",(char (*) [18])&local_28,
                   (unsigned_long *)") does not match the initially requested size (",
                   (char (*) [48])Args_2,(unsigned_long *)0x647201,in_stack_ffffffffffffffa8);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                   ,0xee);
        std::__cxx11::string::~string((string *)&msg);
        alignment = alignment_local;
      }
      if (Args_2->alignment != alignment) {
        FormatString<char[23],unsigned_long,char[53],unsigned_long,char[2]>
                  (&msg,(Diligent *)"Allocation alignment (",(char (*) [23])&alignment_local,
                   (unsigned_long *)") does not match the initially requested alignment (",
                   (char (*) [53])&Args_2->alignment,(unsigned_long *)0x647201,
                   in_stack_ffffffffffffffa8);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                   ,0xef);
        std::__cxx11::string::~string((string *)&msg);
      }
      sVar6 = Args_2->reserved_size;
    }
    else {
      if ((this->m_DbgAllocations).
          super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->m_DbgAllocations).
          super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        FormatString<char[26],char[25]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"m_DbgAllocations.empty()",Args_1);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                   ,0xf5);
        std::__cxx11::string::~string((string *)&msg);
      }
      sVar6 = 0;
    }
    puVar2 = (uint8_t *)
             AlignUp<unsigned_long,unsigned_long>
                       ((unsigned_long)this->m_pCurrPtr,this->m_CurrAlignment);
    if (this->m_pCurrPtr != puVar2) {
      FormatString<char[43]>(&msg,(char (*) [43])"Current pointer is not aligned as expected");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"Allocate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                 ,0xf9);
      std::__cxx11::string::~string((string *)&msg);
      puVar2 = this->m_pCurrPtr;
    }
    puVar2 = (uint8_t *)AlignUp<unsigned_long,unsigned_long>((unsigned_long)puVar2,alignment_local);
    this->m_pCurrPtr = puVar2;
    this->m_CurrAlignment = alignment_local;
    puVar3 = this->m_pDataStart;
    if ((this->m_DbgUsingExternalMemory == false) && (puVar3 + sVar6 < puVar2 + local_28)) {
      FormatString<char[76]>
                (&msg,(char (*) [76])
                      "Allocation size exceeds the initially reserved space. This is likely a bug.")
      ;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"Allocate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                 ,0xfe);
      std::__cxx11::string::~string((string *)&msg);
      puVar3 = this->m_pDataStart;
      puVar2 = this->m_pCurrPtr;
    }
    this->m_pCurrPtr = puVar2 + local_28;
    if (puVar3 + this->m_ReservedSize < puVar2 + local_28) {
      FormatString<char[43]>(&msg,(char (*) [43])"Allocation size exceeds the reserved space");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"Allocate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                 ,0x103);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  return puVar2;
}

Assistant:

NODISCARD void* Allocate(size_t size, size_t alignment = 1)
    {
        VERIFY(size == 0 || m_pDataStart != nullptr, "Memory has not been allocated");
        VERIFY(IsPowerOfTwo(alignment), "Alignment is not a power of two!");

        if (size == 0)
            return nullptr;

        size = AlignUp(size, alignment);

#if DILIGENT_DEBUG
        size_t dbgReservedSize = 0;
        if (!m_DbgUsingExternalMemory)
        {
            VERIFY(m_DbgCurrAllocation < m_DbgAllocations.size(), "Allocation number exceed the number of allocations that were originally reserved.");
            const auto& CurrAllocation = m_DbgAllocations[m_DbgCurrAllocation++];
            VERIFY(CurrAllocation.size == size, "Allocation size (", size, ") does not match the initially requested size (", CurrAllocation.size, ")");
            VERIFY(CurrAllocation.alignment == alignment, "Allocation alignment (", alignment, ") does not match the initially requested alignment (", CurrAllocation.alignment, ")");
            dbgReservedSize = CurrAllocation.reserved_size;
        }
        else
        {
            // Allocating in place in assigned memory
            VERIFY_EXPR(m_DbgAllocations.empty());
        }
#endif

        VERIFY(AlignUp(m_pCurrPtr, m_CurrAlignment) == m_pCurrPtr, "Current pointer is not aligned as expected");
        m_pCurrPtr      = AlignUp(m_pCurrPtr, alignment);
        m_CurrAlignment = alignment;

        VERIFY(m_DbgUsingExternalMemory || m_pCurrPtr + size <= m_pDataStart + dbgReservedSize,
               "Allocation size exceeds the initially reserved space. This is likely a bug.");

        auto* ptr = m_pCurrPtr;
        m_pCurrPtr += size;

        VERIFY(m_pCurrPtr <= m_pDataStart + m_ReservedSize, "Allocation size exceeds the reserved space");

        return ptr;
    }